

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printT2AddrModeImm8OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  MCOperand *op;
  ulong uVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  char *pcVar5;
  int iVar6;
  
  op = MCInst_getOperand(MI,3);
  uVar3 = MCOperand_getImm(op);
  iVar6 = (int)uVar3;
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNum),", ");
  uVar4 = (ulong)(uint)-iVar6;
  if (iVar6 < 0) {
    if (iVar6 < -9) {
      pcVar5 = "#-0x%x";
    }
    else {
      pcVar5 = "#-%u";
    }
  }
  else {
    if (iVar6 < 10) {
      pcVar5 = ", #%u";
    }
    else {
      pcVar5 = ", #0x%x";
    }
    pcVar5 = pcVar5 + 2;
    uVar4 = uVar3 & 0xffffffff;
  }
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),pcVar5,uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = iVar6;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printT2AddrModeImm8OffsetOperand(MCInst *MI,
		unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	int32_t OffImm = (int32_t)MCOperand_getImm(MO1);
	SStream_concat0(O, ", ");
	if (OffImm == INT32_MIN) {
		SStream_concat0(O, "#-0");
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = 0;
			MI->flat_insn->detail->arm.op_count++;
		}
	} else {
		if (OffImm < 0) {
			if (OffImm < -HEX_THRESHOLD)
				SStream_concat(O, "#-0x%x", -OffImm);
			else
				SStream_concat(O, "#-%u", -OffImm);
		} else {
			if (OffImm > HEX_THRESHOLD)
				SStream_concat(O, "#0x%x", OffImm);
			else
				SStream_concat(O, "#%u", OffImm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = OffImm;
			MI->flat_insn->detail->arm.op_count++;
		}
	}
}